

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JustInTime.hpp
# Opt level: O2

unique_ptr<const_TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
 __thiscall
JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
          (JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *this)

{
  __atomic_flag_data_type _Var1;
  _Head_base<0UL,_const_TI::TMS::TMS9918<(TI::TMS::Personality)0>_*,_false> extraout_RDX;
  JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *in_RSI;
  unique_ptr<const_TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
  uVar2;
  
  LOCK();
  _Var1 = (in_RSI->flush_concurrency_check_).super___atomic_flag_base._M_i;
  (in_RSI->flush_concurrency_check_).super___atomic_flag_base._M_i = true;
  UNLOCK();
  if (_Var1 == false) {
    flush(in_RSI);
    LOCK();
    (in_RSI->flush_concurrency_check_).super___atomic_flag_base._M_i = false;
    UNLOCK();
    (this->super_Observer)._vptr_Observer = (_func_int **)in_RSI;
    *(TMS9918<(TI::TMS::Personality)0> **)&(this->object_).super_Base<(TI::TMS::Personality)0>.crt_
         = &in_RSI->object_;
    uVar2._M_t.
    super___uniq_ptr_impl<const_TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_const_TI::TMS::TMS9918<(TI::TMS::Personality)0>_*,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    .super__Head_base<0UL,_const_TI::TMS::TMS9918<(TI::TMS::Personality)0>_*,_false>._M_head_impl =
         extraout_RDX._M_head_impl;
    uVar2._M_t.
    super___uniq_ptr_impl<const_TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_const_TI::TMS::TMS9918<(TI::TMS::Personality)0>_*,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    .
    super__Tuple_impl<1UL,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    .
    super__Head_base<1UL,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
    ._M_head_impl.actor_ =
         (_Head_base<1UL,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
          )(_Head_base<1UL,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
            )this;
    return (unique_ptr<const_TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
            )uVar2._M_t.
             super___uniq_ptr_impl<const_TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
             ._M_t.
             super__Tuple_impl<0UL,_const_TI::TMS::TMS9918<(TI::TMS::Personality)0>_*,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ;
  }
  __assert_fail("!non_const_this->flush_concurrency_check_.test_and_set()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/MSX/../../ClockReceiver/JustInTime.hpp"
                ,0x8d,
                "auto JustInTimeActor<TI::TMS::TMS9918<TI::TMS::TMS9918A>>::operator->() const [T = TI::TMS::TMS9918<TI::TMS::TMS9918A>, LocalTimeScale = HalfCycles, multiplier = 1, divider = 1]"
               );
}

Assistant:

[[nodiscard]] forceinline auto operator -> () const {
			auto non_const_this = const_cast<JustInTimeActor<T, LocalTimeScale, multiplier, divider> *>(this);
#ifndef NDEBUG
			assert(!non_const_this->flush_concurrency_check_.test_and_set());
#endif
			non_const_this->flush();
#ifndef NDEBUG
			non_const_this->flush_concurrency_check_.clear();
#endif
			return std::unique_ptr<const T, SequencePointAwareDeleter>(&object_, SequencePointAwareDeleter(non_const_this));
		}